

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpeg_stream_writer.h
# Opt level: O2

void __thiscall
charls::jpeg_stream_writer::write_uint<unsigned_int>(jpeg_stream_writer *this,uint value)

{
  uint big_endian_value;
  
  if (this->byte_offset_ + 4 <= (this->destination_).size) {
    write_bytes(this,&big_endian_value,4);
    return;
  }
  __assert_fail("byte_offset_ + sizeof(UnsignedIntType) <= destination_.size",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/src/jpeg_stream_writer.h"
                ,0xa9,
                "void charls::jpeg_stream_writer::write_uint(const UnsignedIntType) [UnsignedIntType = unsigned int]"
               );
}

Assistant:

void write_uint(const UnsignedIntType value) noexcept
    {
        ASSERT(byte_offset_ + sizeof(UnsignedIntType) <= destination_.size);

        // Use write_bytes to write to the unaligned byte array.
        // The compiler will perform the correct optimization when the target platform support unaligned writes.
#ifdef LITTLE_ENDIAN_ARCHITECTURE
        const UnsignedIntType big_endian_value{byte_swap(value)};
#else
        const UnsignedIntType big_endian_value{value};
#endif
        write_bytes(&big_endian_value, sizeof big_endian_value);
    }